

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment.cpp
# Opt level: O3

Alignment * __thiscall
jhu::thrax::readAlignment(Alignment *__return_storage_ptr__,thrax *this,string_view sv)

{
  Point *pPVar1;
  Point PVar2;
  Point PVar3;
  char *pcVar4;
  thrax *ptVar5;
  long lVar6;
  ulong uVar7;
  invalid_argument *piVar8;
  char *pcVar9;
  size_type __n;
  Point *pPVar10;
  char *__nptr;
  pointer pPVar11;
  pointer pPVar12;
  __normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  __i;
  pointer pPVar13;
  char *e;
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar9 = (char *)sv._M_len;
  if (this == (thrax *)0x0) {
    __n = 0;
  }
  else {
    ptVar5 = (thrax *)0x0;
    __n = 0;
    do {
      __n = __n + (pcVar9[(long)ptVar5] == '-');
      ptVar5 = ptVar5 + 1;
    } while (this != ptVar5);
  }
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)local_50);
  pPVar11 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar12 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pPVar11 != pPVar12) {
    __nptr = pcVar9;
    do {
      lVar6 = strtol(__nptr,&local_58,10);
      pcVar4 = local_58;
      pPVar11->src = (PointType)lVar6;
      if (local_58 == __nptr) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pcVar9,this + (long)pcVar9);
        std::invalid_argument::invalid_argument(piVar8,(string *)local_50);
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      lVar6 = strtol(local_58,&local_58,10);
      pPVar11->tgt = -(short)lVar6;
      if (local_58 == pcVar4) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pcVar9,this + (long)pcVar9);
        std::invalid_argument::invalid_argument(piVar8,(string *)local_50);
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      pPVar11 = pPVar11 + 1;
      __nptr = local_58;
    } while (pPVar11 != pPVar12);
    pPVar11 = (__return_storage_ptr__->
              super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pPVar12 = (__return_storage_ptr__->
              super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (pPVar11 != pPVar12) {
    uVar7 = (long)pPVar12 - (long)pPVar11 >> 2;
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
              (pPVar11,pPVar12,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pPVar12 - (long)pPVar11 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                (pPVar11,pPVar12);
    }
    else {
      pPVar13 = pPVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                (pPVar11,pPVar13);
      for (; pPVar13 != pPVar12; pPVar13 = pPVar13 + 1) {
        PVar3 = *pPVar13;
        PVar2 = pPVar13[-1];
        pPVar10 = pPVar13;
        while ((int)PVar3 * 0x10000 < (int)PVar2 * 0x10000) {
          *pPVar10 = PVar2;
          pPVar1 = pPVar10 + -2;
          pPVar10 = pPVar10 + -1;
          PVar2 = *pPVar1;
        }
        *pPVar10 = PVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Alignment readAlignment(std::string_view sv) {
  Alignment result(std::count(sv.begin(), sv.end(), '-'));
  auto s = sv.data();
  char* e;
  for (auto& p : result) {
    p.src = std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
    p.tgt = -std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
  }
  std::sort(result.begin(), result.end(), bySource);
  return result;
}